

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 PHYSFS_writeBytes(PHYSFS_File *handle,void *buffer,PHYSFS_uint64 _len)

{
  PHYSFS_uint64 maxlen;
  FileHandle *fh;
  size_t len;
  PHYSFS_uint64 _len_local;
  void *buffer_local;
  PHYSFS_File *handle_local;
  
  if (_len < 0x8000000000000000) {
    if (*(char *)&handle[1].opaque == '\0') {
      if (_len == 0) {
        handle_local = (PHYSFS_File *)0x0;
      }
      else if (handle[3].opaque == (void *)0x0) {
        handle_local = (PHYSFS_File *)
                       (**(code **)((long)handle->opaque + 0x18))(handle->opaque,buffer,_len);
      }
      else {
        handle_local = (PHYSFS_File *)doBufferedWrite(handle,buffer,_len);
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_OPEN_FOR_READING);
      handle_local = (PHYSFS_File *)0xffffffffffffffff;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    handle_local = (PHYSFS_File *)0xffffffffffffffff;
  }
  return (PHYSFS_sint64)handle_local;
}

Assistant:

PHYSFS_sint64 PHYSFS_writeBytes(PHYSFS_File *handle, const void *buffer,
                                PHYSFS_uint64 _len)
{
    const size_t len = (size_t) _len;
    FileHandle *fh = (FileHandle *) handle;

#ifdef PHYSFS_NO_64BIT_SUPPORT
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFF);
#else
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFFFFFFFFFF);
#endif

    if (!__PHYSFS_ui64FitsAddressSpace(_len))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, -1);

    BAIL_IF(_len > maxlen, PHYSFS_ERR_INVALID_ARGUMENT, -1);
    BAIL_IF(fh->forReading, PHYSFS_ERR_OPEN_FOR_READING, -1);
    BAIL_IF_ERRPASS(len == 0, 0);
    if (fh->buffer)
        return doBufferedWrite(handle, buffer, len);

    return fh->io->write(fh->io, buffer, len);
}